

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

gnode_t * parse_compound_statement(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer;
  gtoken_s token_00;
  _Bool _Var1;
  gtoken_t token_01;
  uint uVar2;
  gnode_r *stmts;
  gnode_t *pgVar3;
  gnode_t **__ptr;
  size_t sVar4;
  size_t sVar5;
  gtoken_s token;
  gtoken_s end_token;
  
  parse_required(parser,TOK_OP_OPEN_CURLYBRACE);
  lexer = parser->lexer->p[parser->lexer->n - 1];
  gravity_lexer_token(lexer);
  stmts = gnode_array_create();
  while( true ) {
    token_01 = gravity_lexer_peek(lexer);
    _Var1 = token_isstatement(token_01);
    if (!_Var1) {
      parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
      gravity_lexer_token(lexer);
      sVar4 = parser->declarations->n;
      if (sVar4 == 0) {
        pgVar3 = (gnode_t *)0x0;
      }
      else {
        pgVar3 = parser->declarations->p[sVar4 - 1];
      }
      token_00.colno = token.colno;
      token_00._0_8_ = token._0_8_;
      token_00.position = token.position;
      token_00.bytes = token.bytes;
      token_00.length = token.length;
      token_00.fileid = token.fileid;
      token_00.builtin = token.builtin;
      token_00.value = token.value;
      pgVar3 = gnode_block_stat_create
                         (NODE_COMPOUND_STAT,token_00,stmts,pgVar3,
                          (end_token.length + end_token.position) - token.position);
      return pgVar3;
    }
    uVar2 = parser->depth + 1;
    parser->depth = uVar2;
    if (1000 < uVar2) break;
    pgVar3 = parse_statement(parser);
    if (pgVar3 != (gnode_t *)0x0) {
      sVar4 = stmts->n;
      __ptr = stmts->p;
      if (sVar4 == stmts->m) {
        sVar5 = sVar4 * 2;
        if (sVar4 == 0) {
          sVar5 = 8;
        }
        stmts->m = sVar5;
        __ptr = (gnode_t **)realloc(__ptr,sVar5 << 3);
        stmts->p = __ptr;
        sVar4 = stmts->n;
      }
      stmts->n = sVar4 + 1;
      __ptr[sVar4] = pgVar3;
    }
    parser->depth = parser->depth - 1;
  }
  gravity_lexer_token(lexer);
  report_error(parser,GRAVITY_ERROR_SYNTAX,0x14049d);
  return (gnode_t *)0x0;
}

Assistant:

static gnode_t *parse_compound_statement (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_compound_statement");

    // '{' (statement+)? '}'

    // check and consume TOK_OP_OPEN_CURLYBRACE
    parse_required(parser, TOK_OP_OPEN_CURLYBRACE);

    DECLARE_LEXER;
    gtoken_s token = gravity_lexer_token(lexer);
    gnode_r *stmts = gnode_array_create();
    while (token_isstatement(gravity_lexer_peek(lexer))) {
        if (++parser->depth > MAX_RECURSION_DEPTH) {
            REPORT_ERROR(gravity_lexer_token(lexer), "Maximum statement recursion depth reached.");
            return NULL;
        }
        gnode_t *node = parse_statement(parser);
        if (node) gnode_array_push(stmts, node);
        --parser->depth;
    }

    // check and consume TOK_OP_CLOSED_CURLYBRACE
    parse_required(parser, TOK_OP_CLOSED_CURLYBRACE);

	// read current token to extract node total length
	gtoken_s end_token = gravity_lexer_token(lexer);

    return gnode_block_stat_create(NODE_COMPOUND_STAT, token, stmts, LAST_DECLARATION(), end_token.position + end_token.length - token.position);
}